

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

ControlBlock * __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
::next_valid(heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
             *this,ControlBlock *i_from)

{
  ControlBlock *local_28;
  ControlBlock *curr;
  ControlBlock *i_from_local;
  heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  local_28 = (ControlBlock *)(i_from->m_next & 0xfffffffffffffffc);
  while( true ) {
    if (local_28 == this->m_tail) {
      return (ControlBlock *)0x0;
    }
    if ((local_28->m_next & 3) == 0) break;
    local_28 = (ControlBlock *)(local_28->m_next & 0xfffffffffffffff8);
  }
  return local_28;
}

Assistant:

ControlBlock * next_valid(ControlBlock * i_from) const
        {
            DENSITY_ASSUME(i_from != m_tail);
            for (auto curr =
                   reinterpret_cast<ControlBlock *>(i_from->m_next & ~static_cast<uintptr_t>(3));
                 curr != m_tail;)
            {
                if ((curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0)
                {
                    return curr;
                }
                curr = reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
            }
            return nullptr;
        }